

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Function.cpp
# Opt level: O3

void __thiscall
Function::Function(Function *this,Visibility visibility,string *name,string *returnType,
                  vector<Variable_*,_std::allocator<Variable_*>_> *params,
                  vector<Variable_*,_std::allocator<Variable_*>_> *localVars,int position)

{
  (this->sizes).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->sizes).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->localVars).super__Vector_base<Variable_*,_std::allocator<Variable_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->localVars).super__Vector_base<Variable_*,_std::allocator<Variable_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->params).super__Vector_base<Variable_*,_std::allocator<Variable_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->localVars).super__Vector_base<Variable_*,_std::allocator<Variable_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->params).super__Vector_base<Variable_*,_std::allocator<Variable_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->params).super__Vector_base<Variable_*,_std::allocator<Variable_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->sizes).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (this->name)._M_dataplus._M_p = (pointer)&(this->name).field_2;
  (this->name)._M_string_length = 0;
  (this->name).field_2._M_local_buf[0] = '\0';
  (this->returnType)._M_dataplus._M_p = (pointer)&(this->returnType).field_2;
  (this->returnType)._M_string_length = 0;
  (this->returnType).field_2._M_local_buf[0] = '\0';
  (this->tag)._M_dataplus._M_p = (pointer)&(this->tag).field_2;
  (this->tag)._M_string_length = 0;
  (this->tag).field_2._M_local_buf[0] = '\0';
  this->visibility = visibility;
  std::__cxx11::string::operator=((string *)&this->name,(string *)name);
  std::__cxx11::string::operator=((string *)&this->returnType,(string *)returnType);
  std::vector<Variable_*,_std::allocator<Variable_*>_>::_M_move_assign(&this->params,params);
  std::vector<Variable_*,_std::allocator<Variable_*>_>::_M_move_assign(&this->localVars,localVars);
  this->position = position;
  this->isDefined = false;
  this->offset = 0;
  this->size = 0;
  return;
}

Assistant:

Function::Function(Enums::Visibility visibility, std::string name, std::string returnType, std::vector<Variable *> params,
                   std::vector<Variable *> localVars, int position) {
    this->visibility = visibility;
    this->name = std::move(name);
    this->returnType = std::move(returnType);
    this->params = std::move(params);
    this->localVars = std::move(localVars);
    this->position = position;
    this->isDefined = false;
    this->offset = 0;
    this->size = 0;
}